

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BerdySparseMAPSolver.cpp
# Opt level: O0

void __thiscall
iDynTree::BerdySparseMAPSolver::BerdySparseMAPSolverPimpl::computeMAP
          (BerdySparseMAPSolverPimpl *this,bool computePermutation)

{
  Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *this_00;
  byte in_SIL;
  long in_RDI;
  BerdyHelper *in_stack_fffffffffffff288;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>,_const_Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_2>,_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>_>
  *in_stack_fffffffffffff290;
  VectorDynSize *in_stack_fffffffffffff298;
  SparseMatrix<double,_0,_int> *in_stack_fffffffffffff2a0;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
  *other;
  VectorDynSize *in_stack_fffffffffffff2a8;
  VectorDynSize *vec;
  MatrixBase<Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_2>,_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>_>
  *in_stack_fffffffffffff2b0;
  BerdyHelper *in_stack_fffffffffffff2b8;
  SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_> *in_stack_fffffffffffff2c0;
  SparseMatrix<(iDynTree::MatrixStorageOrdering)1> *in_stack_fffffffffffff2c8;
  Product<Eigen::Product<Eigen::Transpose<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_2>,_Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_2>
  *in_stack_fffffffffffff2f8;
  SparseMatrix<double,_0,_int> *in_stack_fffffffffffff300;
  SparseMatrixBase<Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_2>,_Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_2>_>
  *in_stack_fffffffffffff3a8;
  SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_> *in_stack_fffffffffffff3b0;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
  local_bd0 [608];
  VectorDynSize local_970 [496];
  MatrixBase<Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_2>,_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>_>
  local_780 [112];
  Solve<Eigen::SimplicialLDLT<Eigen::SparseMatrix<double,_0,_int>,_1,_Eigen::AMDOrdering<int>_>,_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
  local_710;
  SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_> local_298 [512];
  SparseMatrix<(iDynTree::MatrixStorageOrdering)1> local_98 [64];
  int local_58;
  byte local_9;
  
  local_9 = in_SIL & 1;
  BerdyHelper::getBerdyMatrices
            (in_stack_fffffffffffff2b8,
             (SparseMatrix<(iDynTree::MatrixStorageOrdering)1> *)in_stack_fffffffffffff2b0,
             in_stack_fffffffffffff2a8,
             (SparseMatrix<(iDynTree::MatrixStorageOrdering)1> *)in_stack_fffffffffffff2a0,
             in_stack_fffffffffffff298);
  BerdyHelper::getOptions(in_stack_fffffffffffff288);
  BerdyOptions::~BerdyOptions((BerdyOptions *)in_stack_fffffffffffff290);
  if (local_58 == 2) {
    in_stack_fffffffffffff2b0 = local_780;
    toEigen(in_stack_fffffffffffff2c8);
    Eigen::SparseMatrix<double,0,int>::operator=
              (in_stack_fffffffffffff2a0,
               (SparseMatrixBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>
                *)in_stack_fffffffffffff298);
    Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>::~Map
              ((Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_> *)0x5a75d4);
    iDynTree::VectorDynSize::operator=
              ((VectorDynSize *)(in_RDI + 0x2d8),(VectorDynSize *)(in_RDI + 0xe0));
  }
  else {
    in_stack_fffffffffffff2c8 = local_98;
    toEigen(in_stack_fffffffffffff2c8);
    Eigen::SparseMatrix<double,0,int>::operator=
              (in_stack_fffffffffffff2a0,
               (SparseMatrixBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>
                *)in_stack_fffffffffffff298);
    Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>::~Map
              ((Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_> *)0x5a6fef);
    in_stack_fffffffffffff2c0 = local_298;
    toEigen(in_stack_fffffffffffff2c8);
    Eigen::
    SparseMatrixBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>::
    transpose((SparseMatrixBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>
               *)in_stack_fffffffffffff298);
    toEigen(in_stack_fffffffffffff2c8);
    Eigen::
    SparseMatrixBase<Eigen::Transpose<Eigen::Map<Eigen::SparseMatrix<double,0,int>,0,Eigen::Stride<0,0>>>>
    ::operator*((SparseMatrixBase<Eigen::Transpose<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>_>
                 *)in_stack_fffffffffffff2a8,
                (SparseMatrixBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>
                 *)in_stack_fffffffffffff2a0);
    toEigen(in_stack_fffffffffffff2c8);
    Eigen::
    SparseMatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Map<Eigen::SparseMatrix<double,0,int>,0,Eigen::Stride<0,0>>>,Eigen::Map<Eigen::SparseMatrix<double,0,int>,0,Eigen::Stride<0,0>>,2>>
    ::operator*((SparseMatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_2>_>
                 *)in_stack_fffffffffffff2a8,
                (SparseMatrixBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>
                 *)in_stack_fffffffffffff2a0);
    Eigen::SparseMatrixBase<Eigen::SparseMatrix<double,0,int>>::operator+=
              (in_stack_fffffffffffff3b0,in_stack_fffffffffffff3a8);
    Eigen::
    Product<Eigen::Product<Eigen::Transpose<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_2>,_Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_2>
    ::~Product((Product<Eigen::Product<Eigen::Transpose<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_2>,_Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_2>
                *)in_stack_fffffffffffff290);
    Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>::~Map
              ((Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_> *)0x5a70c7);
    Eigen::
    Product<Eigen::Transpose<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_2>
    ::~Product((Product<Eigen::Transpose<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_2>
                *)in_stack_fffffffffffff290);
    Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>::~Map
              ((Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_> *)0x5a70e1);
    Eigen::Transpose<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>::
    ~Transpose((Transpose<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>
                *)0x5a70ee);
    Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>::~Map
              ((Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_> *)0x5a70fb);
    if ((local_9 & 1) != 0) {
      Eigen::SimplicialLDLT<Eigen::SparseMatrix<double,_0,_int>,_1,_Eigen::AMDOrdering<int>_>::
      analyzePattern((SimplicialLDLT<Eigen::SparseMatrix<double,_0,_int>,_1,_Eigen::AMDOrdering<int>_>
                      *)in_stack_fffffffffffff290,(MatrixType *)in_stack_fffffffffffff288);
    }
    Eigen::SimplicialLDLT<Eigen::SparseMatrix<double,_0,_int>,_1,_Eigen::AMDOrdering<int>_>::
    factorize((SimplicialLDLT<Eigen::SparseMatrix<double,_0,_int>,_1,_Eigen::AMDOrdering<int>_> *)
              in_stack_fffffffffffff290,(MatrixType *)in_stack_fffffffffffff288);
    toEigen(in_stack_fffffffffffff2c8);
    toEigen(in_stack_fffffffffffff2a8);
    Eigen::SparseMatrixBase<Eigen::Map<Eigen::SparseMatrix<double,0,int>,0,Eigen::Stride<0,0>>>::
    operator*((SparseMatrixBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>
               *)in_stack_fffffffffffff2a8,
              (MatrixBase<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
               *)in_stack_fffffffffffff2a0);
    toEigen(in_stack_fffffffffffff2c8);
    Eigen::
    SparseMatrixBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>::
    transpose((SparseMatrixBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>
               *)in_stack_fffffffffffff298);
    toEigen(in_stack_fffffffffffff2c8);
    Eigen::
    SparseMatrixBase<Eigen::Transpose<Eigen::Map<Eigen::SparseMatrix<double,0,int>,0,Eigen::Stride<0,0>>>>
    ::operator*((SparseMatrixBase<Eigen::Transpose<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>_>
                 *)in_stack_fffffffffffff2a8,
                (SparseMatrixBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>
                 *)in_stack_fffffffffffff2a0);
    toEigen(in_stack_fffffffffffff2a8);
    Eigen::
    SparseMatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Map<Eigen::SparseMatrix<double,0,int>,0,Eigen::Stride<0,0>>>,Eigen::Map<Eigen::SparseMatrix<double,0,int>,0,Eigen::Stride<0,0>>,2>>
    ::operator*((SparseMatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_2>_>
                 *)in_stack_fffffffffffff2a8,
                (MatrixBase<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                 *)in_stack_fffffffffffff2a0);
    Eigen::
    MatrixBase<Eigen::Product<Eigen::Map<Eigen::SparseMatrix<double,0,int>,0,Eigen::Stride<0,0>>,Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>,0>>
    ::operator-((MatrixBase<Eigen::Product<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>_>
                 *)in_stack_fffffffffffff2b8,in_stack_fffffffffffff2b0);
    toEigen(in_stack_fffffffffffff2a8);
    Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>::operator=
              ((Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)
               in_stack_fffffffffffff290,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>,_const_Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_2>,_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>_>_>
                *)in_stack_fffffffffffff288);
    Eigen::
    CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>,_const_Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_2>,_Eigen::Map<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>_>
    ::~CwiseBinaryOp(in_stack_fffffffffffff290);
    Eigen::
    Product<Eigen::Product<Eigen::Transpose<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_2>,_Eigen::Map<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
    ::~Product((Product<Eigen::Product<Eigen::Transpose<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_2>,_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                *)0x5a73a3);
    Eigen::
    Product<Eigen::Transpose<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_2>
    ::~Product((Product<Eigen::Transpose<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_2>
                *)in_stack_fffffffffffff290);
    Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>::~Map
              ((Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_> *)0x5a73bd);
    Eigen::Transpose<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>::
    ~Transpose((Transpose<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>
                *)0x5a73ca);
    Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>::~Map
              ((Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_> *)0x5a73d7);
    Eigen::
    Product<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
    ::~Product((Product<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                *)0x5a73e4);
    Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>::~Map
              ((Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_> *)0x5a73f1);
    in_stack_fffffffffffff2b8 = (BerdyHelper *)(in_RDI + 1000);
    toEigen(in_stack_fffffffffffff2a8);
    local_710 = Eigen::
                SparseSolverBase<Eigen::SimplicialLDLT<Eigen::SparseMatrix<double,0,int>,1,Eigen::AMDOrdering<int>>>
                ::solve<Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>>
                          ((SparseSolverBase<Eigen::SimplicialLDLT<Eigen::SparseMatrix<double,_0,_int>,_1,_Eigen::AMDOrdering<int>_>_>
                            *)in_stack_fffffffffffff290,
                           (MatrixBase<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                            *)in_stack_fffffffffffff288);
    toEigen(in_stack_fffffffffffff2a8);
    Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>::operator=
              ((Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)
               in_stack_fffffffffffff290,
               (DenseBase<Eigen::Solve<Eigen::SimplicialLDLT<Eigen::SparseMatrix<double,_0,_int>,_1,_Eigen::AMDOrdering<int>_>,_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
                *)in_stack_fffffffffffff288);
  }
  vec = local_970;
  toEigen(in_stack_fffffffffffff2c8);
  Eigen::SparseMatrixBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>
  ::transpose((SparseMatrixBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>
               *)in_stack_fffffffffffff298);
  toEigen(in_stack_fffffffffffff2c8);
  Eigen::
  SparseMatrixBase<Eigen::Transpose<Eigen::Map<Eigen::SparseMatrix<double,0,int>,0,Eigen::Stride<0,0>>>>
  ::operator*((SparseMatrixBase<Eigen::Transpose<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>_>
               *)vec,(SparseMatrixBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>
                      *)in_stack_fffffffffffff2a0);
  toEigen(in_stack_fffffffffffff2c8);
  Eigen::
  SparseMatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Map<Eigen::SparseMatrix<double,0,int>,0,Eigen::Stride<0,0>>>,Eigen::Map<Eigen::SparseMatrix<double,0,int>,0,Eigen::Stride<0,0>>,2>>
  ::operator*((SparseMatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_2>_>
               *)vec,(SparseMatrixBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>
                      *)in_stack_fffffffffffff2a0);
  Eigen::SparseMatrix<double,0,int>::operator=(in_stack_fffffffffffff300,in_stack_fffffffffffff2f8);
  Eigen::
  Product<Eigen::Product<Eigen::Transpose<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_2>,_Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_2>
  ::~Product((Product<Eigen::Product<Eigen::Transpose<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_2>,_Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_2>
              *)in_stack_fffffffffffff290);
  Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>::~Map
            ((Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_> *)0x5a76f2);
  Eigen::
  Product<Eigen::Transpose<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_2>
  ::~Product((Product<Eigen::Transpose<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_2>
              *)in_stack_fffffffffffff290);
  Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>::~Map
            ((Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_> *)0x5a770c);
  Eigen::Transpose<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>::
  ~Transpose((Transpose<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_> *
             )0x5a7719);
  Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>::~Map
            ((Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_> *)0x5a7726);
  Eigen::SparseMatrixBase<Eigen::SparseMatrix<double,0,int>>::operator+=
            (in_stack_fffffffffffff2c0,
             (SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_> *)in_stack_fffffffffffff2b8);
  if ((local_9 & 1) != 0) {
    Eigen::SimplicialLDLT<Eigen::SparseMatrix<double,_0,_int>,_1,_Eigen::AMDOrdering<int>_>::
    analyzePattern((SimplicialLDLT<Eigen::SparseMatrix<double,_0,_int>,_1,_Eigen::AMDOrdering<int>_>
                    *)in_stack_fffffffffffff290,(MatrixType *)in_stack_fffffffffffff288);
  }
  Eigen::SimplicialLDLT<Eigen::SparseMatrix<double,_0,_int>,_1,_Eigen::AMDOrdering<int>_>::factorize
            ((SimplicialLDLT<Eigen::SparseMatrix<double,_0,_int>,_1,_Eigen::AMDOrdering<int>_> *)
             in_stack_fffffffffffff290,(MatrixType *)in_stack_fffffffffffff288);
  other = local_bd0;
  toEigen(in_stack_fffffffffffff2c8);
  Eigen::SparseMatrixBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>
  ::transpose((SparseMatrixBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>
               *)in_stack_fffffffffffff298);
  toEigen(in_stack_fffffffffffff2c8);
  Eigen::
  SparseMatrixBase<Eigen::Transpose<Eigen::Map<Eigen::SparseMatrix<double,0,int>,0,Eigen::Stride<0,0>>>>
  ::operator*((SparseMatrixBase<Eigen::Transpose<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>_>
               *)vec,(SparseMatrixBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>
                      *)other);
  toEigen(vec);
  toEigen(vec);
  Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>>::operator-
            ((MatrixBase<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
              *)in_stack_fffffffffffff2b8,
             (MatrixBase<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
              *)in_stack_fffffffffffff2b0);
  Eigen::
  SparseMatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Map<Eigen::SparseMatrix<double,0,int>,0,Eigen::Stride<0,0>>>,Eigen::Map<Eigen::SparseMatrix<double,0,int>,0,Eigen::Stride<0,0>>,2>>
  ::operator*((SparseMatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_2>_>
               *)vec,other);
  toEigen(vec);
  Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>::operator=
            ((Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)
             in_stack_fffffffffffff290,
             (DenseBase<Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_2>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_0>_>
              *)in_stack_fffffffffffff288);
  Eigen::
  Product<Eigen::Product<Eigen::Transpose<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_2>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Map<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_0>
  ::~Product((Product<Eigen::Product<Eigen::Transpose<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_2>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_0>
              *)0x5a7984);
  Eigen::
  Product<Eigen::Transpose<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_2>
  ::~Product((Product<Eigen::Transpose<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_2>
              *)in_stack_fffffffffffff290);
  Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>::~Map
            ((Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_> *)0x5a799e);
  Eigen::Transpose<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>::
  ~Transpose((Transpose<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_> *
             )0x5a79ab);
  Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>::~Map
            ((Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_> *)0x5a79b8);
  this_00 = (Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)(in_RDI + 0x2f8)
  ;
  toEigen(vec);
  Eigen::SparseMatrixBase<Eigen::SparseMatrix<double,0,int>>::operator*
            ((SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_> *)vec,
             (MatrixBase<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
              *)other);
  toEigen(vec);
  Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>>::operator+=
            ((MatrixBase<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
              *)in_stack_fffffffffffff2b0,
             (MatrixBase<Eigen::Product<Eigen::SparseMatrix<double,_0,_int>,_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>_>
              *)vec);
  toEigen(vec);
  Eigen::
  SparseSolverBase<Eigen::SimplicialLDLT<Eigen::SparseMatrix<double,0,int>,1,Eigen::AMDOrdering<int>>>
  ::solve<Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>>
            ((SparseSolverBase<Eigen::SimplicialLDLT<Eigen::SparseMatrix<double,_0,_int>,_1,_Eigen::AMDOrdering<int>_>_>
              *)this_00,
             (MatrixBase<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
              *)in_stack_fffffffffffff288);
  toEigen(vec);
  Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>::operator=
            (this_00,(DenseBase<Eigen::Solve<Eigen::SimplicialLDLT<Eigen::SparseMatrix<double,_0,_int>,_1,_Eigen::AMDOrdering<int>_>,_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
                      *)in_stack_fffffffffffff288);
  return;
}

Assistant:

void BerdySparseMAPSolver::BerdySparseMAPSolverPimpl::computeMAP(bool computePermutation)
    {
        /*
         * Get berdy matrices
         */
        berdy.getBerdyMatrices(dynamicsConstraintsMatrix,
                               dynamicsConstraintsBias,
                               measurementsMatrix,
                               measurementsBias);


        // Compute the maximum a posteriori probability
        // See Latella et al., "Whole-Body Human Inverse Dynamics with
        // Distributed Micro-Accelerometers, Gyros and Force Sensing" in Sensors, 2016

        // Intermediate quantities

        if(berdy.getOptions().berdyVariant!=BERDY_FLOATING_BASE_NON_COLLOCATED_EXT_WRENCHES)
        {
            // Covariance matrix of the prior of the dynamics: var[p(d)], Eq. 10a
            //TODO: find a way to map to iDynTree::SparseMatrix
            covarianceDynamicsPriorInverse
            //    toEigen(m_intermediateQuantities.covarianceDynamicsPriorInverse)
            //Better to assign the "sum" before, and adding the product part later
            = toEigen(priorDynamicsRegularizationCovarianceInverse);

            covarianceDynamicsPriorInverse += toEigen(dynamicsConstraintsMatrix).transpose() * toEigen(priorDynamicsConstraintsCovarianceInverse) * toEigen(dynamicsConstraintsMatrix);

            // decompose m_covarianceDynamicsPriorInverse
            if (computePermutation) {
                covarianceDynamicsPriorInverseDecomposition.analyzePattern(covarianceDynamicsPriorInverse);
            }
            //    m_intermediateQuantities.covarianceDynamicsPriorInverseDecomposition.factorize(toEigen(m_intermediateQuantities.covarianceDynamicsPriorInverse));
            covarianceDynamicsPriorInverseDecomposition.factorize(covarianceDynamicsPriorInverse);

            // Expected value of the prior of the dynamics: E[p(d)], Eq. 10b
            toEigen(expectedDynamicsPriorRHS) = toEigen(priorDynamicsRegularizationCovarianceInverse) * toEigen(priorDynamicsRegularizationExpectedValue) - toEigen(dynamicsConstraintsMatrix).transpose() * toEigen(priorDynamicsConstraintsCovarianceInverse) * toEigen(dynamicsConstraintsBias);

            toEigen(expectedDynamicsPrior) =
            covarianceDynamicsPriorInverseDecomposition.solve(toEigen(expectedDynamicsPriorRHS));
        }
        else
        {
            // Modified eq. 10a and 10b without the dynamics constraints
            covarianceDynamicsPriorInverse = toEigen(priorDynamicsRegularizationCovarianceInverse);
            expectedDynamicsPrior = priorDynamicsRegularizationExpectedValue;
        }
        
        // Final result: covariance matrix of the whole-body dynamics, Eq. 11a
        //TODO: find a way to map to iDynTree::SparseMatrix
        covarianceDynamicsAPosterioriInverse = toEigen(measurementsMatrix).transpose() * toEigen(priorMeasurementsCovarianceInverse) * toEigen(measurementsMatrix);
        covarianceDynamicsAPosterioriInverse += covarianceDynamicsPriorInverse;


        // decompose m_covarianceDynamicsAPosterioriInverse
        if (computePermutation) {
            //        m_intermediateQuantities.covarianceDynamicsAPosterioriInverseDecomposition.analyzePattern(toEigen(m_covarianceDynamicsAPosterioriInverse));
            covarianceDynamicsAPosterioriInverseDecomposition.analyzePattern(covarianceDynamicsAPosterioriInverse);
        }
        //    m_intermediateQuantities.covarianceDynamicsAPosterioriInverseDecomposition.factorize(toEigen(m_covarianceDynamicsAPosterioriInverse));
        covarianceDynamicsAPosterioriInverseDecomposition.factorize(covarianceDynamicsAPosterioriInverse);

        // Final result: expected value of the whole-body dynamics, Eq. 11b
        toEigen(expectedDynamicsAPosterioriRHS) = toEigen(measurementsMatrix).transpose() * toEigen(priorMeasurementsCovarianceInverse) * (toEigen(measurements) - toEigen(measurementsBias));
        toEigen(expectedDynamicsAPosterioriRHS) += covarianceDynamicsPriorInverse * toEigen(expectedDynamicsPrior);
        
        toEigen(expectedDynamicsAPosteriori) =
        covarianceDynamicsAPosterioriInverseDecomposition.solve(toEigen(expectedDynamicsAPosterioriRHS));
    }